

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O0

size_t chacha_final(chacha_state *S,uint8_t *out)

{
  int iVar1;
  void *in_RSI;
  void *in_RDI;
  chacha_state_internal *state;
  size_t in_stack_000001b8;
  uint8_t *in_stack_000001c0;
  uint8_t *in_stack_000001c8;
  chacha_state_conflict *in_stack_000001d0;
  
  if (*(long *)((long)in_RDI + 0x38) != 0) {
    iVar1 = chacha_is_aligned(in_RSI);
    if (iVar1 == 0) {
      chacha_blocks_ref(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8);
      memcpy(in_RSI,(void *)((long)in_RDI + 0x40),*(size_t *)((long)in_RDI + 0x38));
    }
    else {
      chacha_blocks_ref(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8);
    }
  }
  memset(in_RDI,0,0x80);
  return *(size_t *)((long)in_RDI + 0x38);
}

Assistant:

size_t
chacha_final(chacha_state *S, uint8_t *out) {
    chacha_state_internal *state = (chacha_state_internal *)S;
    if (state->leftover) {
        if (chacha_is_aligned(out)) {
            chacha_blocks_ref(state, state->buffer, out, state->leftover);
        } else {
            chacha_blocks_ref(state, state->buffer, state->buffer, state->leftover);
            memcpy(out, state->buffer, state->leftover);
        }
    }
    memset(S, 0, sizeof(chacha_state));
    return state->leftover;
}